

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O0

void __thiscall
slang::syntax::PropertyDeclarationSyntax::PropertyDeclarationSyntax
          (PropertyDeclarationSyntax *this,
          SyntaxList<slang::syntax::AttributeInstanceSyntax> *attributes,Token keyword,Token name,
          AssertionItemPortListSyntax *portList,Token semi,
          SyntaxList<slang::syntax::LocalVariableDeclarationSyntax> *variables,
          PropertySpecSyntax *propertySpec,Token optionalSemi,Token end,
          NamedBlockClauseSyntax *endBlockName)

{
  Token TVar1;
  Token TVar2;
  Token TVar3;
  iterator ppLVar4;
  PropertySpecSyntax *pPVar5;
  LocalVariableDeclarationSyntax *child;
  iterator __end2;
  iterator __begin2;
  SyntaxList<slang::syntax::LocalVariableDeclarationSyntax> *__range2;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *local_38;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *attributes_local;
  PropertyDeclarationSyntax *this_local;
  Token name_local;
  Token keyword_local;
  
  TVar3 = end;
  TVar2 = optionalSemi;
  TVar1 = semi;
  name_local._0_8_ = name.info;
  this_local = name._0_8_;
  name_local.info = keyword._0_8_;
  local_38 = attributes;
  attributes_local = (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)this;
  MemberSyntax::MemberSyntax(&this->super_MemberSyntax,PropertyDeclaration,attributes);
  *(Info **)&this->keyword = name_local.info;
  (this->keyword).info = keyword.info;
  *(PropertyDeclarationSyntax **)&this->name = this_local;
  (this->name).info = (Info *)name_local._0_8_;
  this->portList = portList;
  (this->semi).kind = semi.kind;
  (this->semi).field_0x2 = semi._2_1_;
  (this->semi).numFlags = (NumericTokenFlags)semi.numFlags.raw;
  (this->semi).rawLen = semi.rawLen;
  semi.info = TVar1.info;
  (this->semi).info = semi.info;
  SyntaxList<slang::syntax::LocalVariableDeclarationSyntax>::SyntaxList(&this->variables,variables);
  __range2 = (SyntaxList<slang::syntax::LocalVariableDeclarationSyntax> *)propertySpec;
  not_null<slang::syntax::PropertySpecSyntax*>::not_null<slang::syntax::PropertySpecSyntax*,void>
            ((not_null<slang::syntax::PropertySpecSyntax*> *)&this->propertySpec,
             (PropertySpecSyntax **)&__range2);
  (this->optionalSemi).kind = optionalSemi.kind;
  (this->optionalSemi).field_0x2 = optionalSemi._2_1_;
  (this->optionalSemi).numFlags = (NumericTokenFlags)optionalSemi.numFlags.raw;
  (this->optionalSemi).rawLen = optionalSemi.rawLen;
  optionalSemi.info = TVar2.info;
  (this->optionalSemi).info = optionalSemi.info;
  (this->end).kind = end.kind;
  (this->end).field_0x2 = end._2_1_;
  (this->end).numFlags = (NumericTokenFlags)end.numFlags.raw;
  (this->end).rawLen = end.rawLen;
  end.info = TVar3.info;
  (this->end).info = end.info;
  this->endBlockName = endBlockName;
  if (this->portList != (AssertionItemPortListSyntax *)0x0) {
    (this->portList->super_SyntaxNode).parent = (SyntaxNode *)this;
  }
  (this->variables).super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)this;
  __end2 = nonstd::span_lite::
           span<slang::syntax::LocalVariableDeclarationSyntax_*,_18446744073709551615UL>::begin
                     (&(this->variables).
                       super_span<slang::syntax::LocalVariableDeclarationSyntax_*,_18446744073709551615UL>
                     );
  ppLVar4 = nonstd::span_lite::
            span<slang::syntax::LocalVariableDeclarationSyntax_*,_18446744073709551615UL>::end
                      (&(this->variables).
                        super_span<slang::syntax::LocalVariableDeclarationSyntax_*,_18446744073709551615UL>
                      );
  for (; __end2 != ppLVar4; __end2 = __end2 + 1) {
    ((*__end2)->super_MemberSyntax).super_SyntaxNode.parent = (SyntaxNode *)this;
  }
  pPVar5 = not_null<slang::syntax::PropertySpecSyntax_*>::operator->(&this->propertySpec);
  (pPVar5->super_SyntaxNode).parent = (SyntaxNode *)this;
  if (this->endBlockName != (NamedBlockClauseSyntax *)0x0) {
    (this->endBlockName->super_SyntaxNode).parent = (SyntaxNode *)this;
  }
  return;
}

Assistant:

PropertyDeclarationSyntax(const SyntaxList<AttributeInstanceSyntax>& attributes, Token keyword, Token name, AssertionItemPortListSyntax* portList, Token semi, const SyntaxList<LocalVariableDeclarationSyntax>& variables, PropertySpecSyntax& propertySpec, Token optionalSemi, Token end, NamedBlockClauseSyntax* endBlockName) :
        MemberSyntax(SyntaxKind::PropertyDeclaration, attributes), keyword(keyword), name(name), portList(portList), semi(semi), variables(variables), propertySpec(&propertySpec), optionalSemi(optionalSemi), end(end), endBlockName(endBlockName) {
        if (this->portList) this->portList->parent = this;
        this->variables.parent = this;
        for (auto child : this->variables)
            child->parent = this;
        this->propertySpec->parent = this;
        if (this->endBlockName) this->endBlockName->parent = this;
    }